

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_dense.hpp
# Opt level: O3

type * Disa::operator+(type *__return_storage_ptr__,Matrix_Dense<double,_2UL,_2UL> *matrix_0,
                      Matrix_Dense<double,_2UL,_2UL> *matrix_1)

{
  _Any_data local_28;
  code *local_18;
  code *local_10;
  
  local_10 = std::
             _Function_handler<double_(unsigned_long,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/include/core/matrix_dense.hpp:488:3)>
             ::_M_invoke;
  local_18 = std::
             _Function_handler<double_(unsigned_long,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/include/core/matrix_dense.hpp:488:3)>
             ::_M_manager;
  local_28._M_unused._M_object = matrix_0;
  local_28._8_8_ = matrix_1;
  Matrix_Dense<double,_2UL,_2UL>::Matrix_Dense
            (__return_storage_ptr__,(function<double_(unsigned_long,_unsigned_long)> *)&local_28,2,2
            );
  if (local_18 != (code *)0x0) {
    (*local_18)(&local_28,&local_28,__destroy_functor);
  }
  return __return_storage_ptr__;
}

Assistant:

typename Static_Promoter<Matrix_Dense<_type, _row_0, _col_0>, Matrix_Dense<_type, _row_1, _col_1>>::type constexpr
operator+(const Matrix_Dense<_type, _row_0, _col_0>& matrix_0, const Matrix_Dense<_type, _row_1, _col_1>& matrix_1) {
  ASSERT_DEBUG(matrix_0.size() == matrix_1.size(),
               "Incompatible matrix dimensions, " + std::to_string(matrix_0.size_row()) + "," +
               std::to_string(matrix_0.size_column()) + " vs. " + std::to_string(matrix_1.size_row()) + "," +
               std::to_string(matrix_1.size_column()) + ".");
  typedef typename Static_Promoter<Matrix_Dense<_type, _row_0, _col_0>, Matrix_Dense<_type, _row_1, _col_1>>::type
  _return_matrix;
  return _return_matrix(
  [&](std::size_t i_row, std::size_t i_column) { return matrix_0[i_row][i_column] + matrix_1[i_row][i_column]; },
  matrix_0.size_row(), matrix_0.size_column());
}